

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.tpl.h
# Opt level: O2

Code * __thiscall
r_exec::Mem<r_exec::LObject,_r_exec::MemVolatile>::check_existence
          (Mem<r_exec::LObject,_r_exec::MemVolatile> *this,Code *object)

{
  (*(object->super__Object)._vptr__Object[4])(object,0);
  r_code::Atom::getDescriptor();
  return object;
}

Assistant:

Code *Mem<O, S>::check_existence(Code *object)
{
    if (object->code(0).getDescriptor() == Atom::GROUP) { // groups are always new.
        return object;
    }

    O *_object;

    if (O::RequiresPacking()) { // false if LObject, true for network-aware objects.
        _object = O::Pack(object, this);    // non compact form will be deleted (P<> in view) if not an instance of O; compact forms are left unchanged.
    } else {
        _object = (O *)object;
    }

    return _object;
}